

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void errline(int n,int k,FILE *err)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  int local_20;
  int local_1c;
  int i;
  int spcnt;
  FILE *err_local;
  int k_local;
  int n_local;
  
  if (*g_argv != (char *)0x0) {
    fprintf((FILE *)err,"%s",*g_argv);
  }
  sVar2 = strlen(*g_argv);
  local_1c = (int)sVar2 + 1;
  local_20 = 1;
  while( true ) {
    bVar3 = false;
    if (local_20 < n) {
      bVar3 = g_argv[local_20] != (char *)0x0;
    }
    if (!bVar3) break;
    fprintf((FILE *)err," %s",g_argv[local_20]);
    sVar2 = strlen(g_argv[local_20]);
    local_1c = (int)sVar2 + 1 + local_1c;
    local_20 = local_20 + 1;
  }
  uVar1 = k + local_1c;
  for (; g_argv[local_20] != (char *)0x0; local_20 = local_20 + 1) {
    fprintf((FILE *)err," %s",g_argv[local_20]);
  }
  if ((int)uVar1 < 0x14) {
    fprintf((FILE *)err,"\n%*s^-- here\n",(ulong)uVar1,"");
  }
  else {
    fprintf((FILE *)err,"\n%*shere --^\n",(ulong)(uVar1 - 7),"");
  }
  return;
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int spcnt, i;
  if( g_argv[0] ) fprintf(err,"%s",g_argv[0]);
  spcnt = lemonStrlen(g_argv[0]) + 1;
  for(i=1; i<n && g_argv[i]; i++){
    fprintf(err," %s",g_argv[i]);
    spcnt += lemonStrlen(g_argv[i])+1;
  }
  spcnt += k;
  for(; g_argv[i]; i++) fprintf(err," %s",g_argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",spcnt-7,"");
  }
}